

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_scalar_partition(uint16_t *data,uint32_t len,uint32_t *flags)

{
  ushort uVar1;
  int iVar2;
  int i;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  uint32_t high [256];
  uint32_t low [256];
  int local_828 [256];
  int local_428 [258];
  
  memset(local_428,0,0x400);
  memset(local_828,0,0x400);
  for (uVar6 = 0; len != uVar6; uVar6 = uVar6 + 1) {
    uVar1 = data[uVar6];
    local_428[(byte)uVar1] = local_428[(byte)uVar1] + 1;
    local_828[uVar1 >> 8] = local_828[uVar1 >> 8] + 1;
  }
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    iVar2 = local_428[lVar3];
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      iVar5 = 0;
      if (((uint)lVar3 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
        iVar5 = iVar2;
      }
      flags[lVar4] = flags[lVar4] + iVar5;
    }
  }
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    iVar2 = local_828[lVar3];
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      iVar5 = 0;
      if (((uint)lVar3 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
        iVar5 = iVar2;
      }
      flags[lVar4 + 8] = flags[lVar4 + 8] + iVar5;
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_scalar_partition(const uint16_t* data, uint32_t len, uint32_t* flags) {
    uint32_t low[256] = {0}, high[256] = {0};

    for (uint32_t i = 0; i < len; ++i) {
        ++low[data[i] & 255];
        ++high[(data[i] >> 8) & 255];
    }

    for (int i = 0; i < 256; ++i) {
        for (int k = 0; k < 8; ++k) {
            flags[k] += ((i & (1 << k)) >> k) * low[i];
        }
    }

    for (int i = 0; i < 256; ++i) {
        for (int k = 0; k < 8; ++k) {
            flags[k+8] += ((i & (1 << k)) >> k) * high[i];
        }
    }

    return 0;
}